

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_enctropy.c
# Opt level: O2

RK_U8 sbacInit(RK_S32 qp,RK_S32 initValue)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = (((initValue >> 4) * 5 + -0x2d) * qp >> 4) + (initValue & 0xfU) * 8;
  iVar4 = iVar1 + -0x10;
  iVar5 = 1;
  if (1 < iVar4) {
    iVar5 = iVar4;
  }
  iVar3 = 0x7e;
  if (iVar5 < 0x7e) {
    iVar3 = iVar5;
  }
  cVar2 = (char)iVar3 + -0x40;
  if (iVar4 < 0x40) {
    cVar2 = '?' - (char)iVar3;
  }
  return cVar2 * '\x02' | SBORROW4(iVar4,0x40) == iVar1 + -0x50 < 0;
}

Assistant:

RK_U8 sbacInit(RK_S32 qp, RK_S32 initValue)
{
    RK_S32  slope      = (initValue >> 4) * 5 - 45;
    RK_S32  offset     = ((initValue & 15) << 3) - 16;
    RK_S32  initState  =  MPP_MIN(MPP_MAX(1, (((slope * qp) >> 4) + offset)), 126);
    RK_U32  mpState = (initState >= 64);
    RK_U8   m_state = ((mpState ? (initState - 64) : (63 - initState)) << 1) + mpState;

    return m_state;
}